

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# N.h
# Opt level: O3

int __thiscall N::connect(N *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  long *plVar1;
  pointer *pppNVar2;
  pointer puVar3;
  N **ppNVar4;
  iterator __position;
  iterator __position_00;
  undefined8 *puVar5;
  uint extraout_EAX;
  long lVar6;
  long *plVar7;
  undefined8 *puVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  undefined4 in_register_00000034;
  long lVar13;
  uint uVar14;
  difference_type s;
  long in_stack_00000008;
  long in_stack_00000010;
  long *in_stack_00000020;
  N *local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  long lVar15;
  
  local_78 = (N *)CONCAT44(in_register_00000034,__fd);
  lVar15 = in_stack_00000010 - in_stack_00000008 >> 3;
  uVar14 = (uint)lVar15;
  lVar6 = lVar15;
  plVar7 = in_stack_00000020;
  uVar11 = uVar14;
  if (in_stack_00000020 != (long *)0x0) {
    do {
      plVar1 = plVar7 + 3;
      lVar6 = lVar6 + (plVar7[1] - *plVar7 >> 3);
      uVar11 = (uint)lVar6;
      plVar7 = (long *)*plVar1;
    } while ((long *)*plVar1 != (long *)0x0);
  }
  if (uVar11 != 0) {
    ppNVar4 = (this->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    __position._M_current =
         (this->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    lVar6 = (long)__position._M_current - (long)ppNVar4 >> 3;
    uVar12 = 0;
    if (__position._M_current == ppNVar4) {
      lVar10 = 0;
    }
    else {
      lVar13 = lVar6 + (ulong)(lVar6 == 0);
      lVar9 = 0;
      do {
        uVar11 = (uint)uVar12;
        lVar10 = lVar9;
        if (ppNVar4[lVar9] == local_78) break;
        uVar11 = uVar11 + (this->osi).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar9];
        uVar12 = (ulong)uVar11;
        lVar9 = lVar9 + 1;
        lVar10 = lVar13;
      } while (lVar13 != lVar9);
      uVar12 = (ulong)(int)uVar11;
    }
    if (lVar6 == lVar10) {
      if (__position._M_current ==
          (this->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<N*,std::allocator<N*>>::_M_realloc_insert<N*const&>
                  ((vector<N*,std::allocator<N*>> *)&this->ps,__position,&local_78);
      }
      else {
        *__position._M_current = local_78;
        pppNVar2 = &(this->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppNVar2 = *pppNVar2 + 1;
      }
      if (in_stack_00000020 != (long *)0x0) {
        do {
          plVar7 = in_stack_00000020 + 1;
          lVar6 = *in_stack_00000020;
          in_stack_00000020 = (long *)in_stack_00000020[3];
          lVar15 = lVar15 + (*plVar7 - lVar6 >> 3);
          uVar14 = (uint)lVar15;
        } while (in_stack_00000020 != (long *)0x0);
      }
      local_70 = CONCAT44(local_70._4_4_,uVar14);
      __position_00._M_current =
           (this->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&this->osi,__position_00,(uint *)&local_70);
      }
      else {
        *__position_00._M_current = uVar14;
        (this->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position_00._M_current + 1;
      }
    }
    else {
      puVar3 = (this->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + lVar10;
      *puVar3 = *puVar3 + 1;
    }
    puVar5 = &stack0x00000008;
    do {
      puVar8 = puVar5;
      puVar5 = (undefined8 *)puVar8[3];
    } while ((undefined8 *)puVar8[3] != (undefined8 *)0x0);
    local_70 = *puVar8;
    uStack_68 = puVar8[1];
    uStack_58 = 0;
    local_60 = uStack_68;
    std::vector<N*,std::allocator<N*>>::
    _M_range_insert<CIt<__gnu_cxx::__normal_iterator<N**,std::vector<N*,std::allocator<N*>>>,N>>
              ((vector<N*,std::allocator<N*>> *)&this->os,
               (this->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
               super__Vector_impl_data._M_start + uVar12);
    uVar11 = extraout_EAX;
  }
  return uVar11;
}

Assistant:

void connect(N* p, nodeit ns) {
        if (ns.size() == 0) return;
        int offset = 0, i = 0;
        while (i < ps.size() and ps[i] != p) offset += osi[i++];

        if (i == ps.size()) {ps.push_back(p); osi.push_back(ns.size());}
        else ++osi[i];

        os.insert(os.begin() + offset, ns.begin(), ns.end());
    }